

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCache.c
# Opt level: O1

void If_ManCacheAnalize(If_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  bool bVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  uint *__ptr;
  void *pvVar12;
  uint *__ptr_00;
  undefined8 *puVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint *puVar22;
  int *piVar23;
  uint uVar24;
  long lVar25;
  Vec_Int_t *vTest [32];
  long alStack_138 [33];
  
  pVVar2 = p->vCutData;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar11 = (int *)malloc(400);
  p_00->pArray = piVar11;
  uVar8 = pVVar2->nSize;
  uVar24 = uVar8 + 3;
  if (-1 < (int)uVar8) {
    uVar24 = uVar8;
  }
  if ((uVar8 & 3) != 0) {
    __assert_fail("Vec_IntSize(vData) % nSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x162,"Vec_Int_t *Hsh_IntManHashArray(Vec_Int_t *, int)");
  }
  uVar24 = (int)uVar24 >> 2;
  piVar11 = (int *)calloc(1,0x20);
  *piVar11 = 4;
  *(Vec_Int_t **)(piVar11 + 2) = pVVar2;
  uVar16 = uVar24 - 1;
  while( true ) {
    do {
      uVar7 = uVar16;
      uVar16 = uVar7 + 1;
    } while ((uVar7 & 1) != 0);
    if (uVar16 < 9) break;
    iVar14 = 5;
    while (uVar16 % (iVar14 - 2U) != 0) {
      uVar6 = iVar14 * iVar14;
      iVar14 = iVar14 + 2;
      if (uVar16 < uVar6) goto LAB_008ae867;
    }
  }
LAB_008ae867:
  __ptr = (uint *)malloc(0x10);
  uVar6 = uVar16;
  if (uVar7 < 0xf) {
    uVar6 = 0x10;
  }
  __ptr[1] = 0;
  *__ptr = uVar6;
  pvVar12 = malloc((long)(int)uVar6 << 2);
  *(void **)(__ptr + 2) = pvVar12;
  __ptr[1] = uVar16;
  if (pvVar12 != (void *)0x0) {
    memset(pvVar12,0xff,(long)(int)uVar16 << 2);
  }
  *(uint **)(piVar11 + 4) = __ptr;
  __ptr_00 = (uint *)malloc(0x10);
  uVar16 = 0x10;
  if (0xe < uVar24 - 1) {
    uVar16 = uVar24;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar16;
  if (uVar16 == 0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pvVar12 = malloc((long)(int)uVar16 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar12;
  *(uint **)(piVar11 + 6) = __ptr_00;
  if (3 < (int)uVar8) {
    uVar17 = 0;
    do {
      if ((int)__ptr[1] < (int)__ptr_00[1]) {
        uVar19 = (ulong)(__ptr[1] * 2 - 1);
        while( true ) {
          do {
            uVar8 = (uint)uVar19;
            uVar16 = uVar8 + 1;
            uVar18 = (ulong)uVar16;
            uVar15 = uVar19 & 1;
            uVar19 = uVar18;
          } while (uVar15 != 0);
          if (uVar16 < 9) break;
          iVar14 = 5;
          while (uVar16 % (iVar14 - 2U) != 0) {
            uVar7 = iVar14 * iVar14;
            iVar14 = iVar14 + 2;
            if (uVar16 < uVar7) goto LAB_008ae985;
          }
        }
LAB_008ae985:
        if ((int)*__ptr < (int)uVar16) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar12 = malloc((long)(int)uVar16 << 2);
          }
          else {
            pvVar12 = realloc(*(void **)(__ptr + 2),(long)(int)uVar16 << 2);
          }
          *(void **)(__ptr + 2) = pvVar12;
          if (pvVar12 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *__ptr = uVar16;
        }
        if (uVar8 < 0x7fffffff) {
          memset(*(void **)(__ptr + 2),0xff,uVar18 << 2);
        }
        __ptr[1] = uVar16;
        if (0 < (int)__ptr_00[1]) {
          lVar25 = *(long *)(__ptr_00 + 2);
          iVar14 = *piVar11;
          uVar19 = (ulong)(uint)(iVar14 * 4);
          lVar21 = 0;
          do {
            uVar8 = *(int *)(lVar25 + lVar21 * 8) * iVar14;
            if (((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) goto LAB_008af008;
            if (uVar19 == 0) {
              uVar16 = 0;
            }
            else {
              uVar15 = 0;
              uVar16 = 0;
              do {
                lVar20 = uVar15 + (ulong)uVar8 * 4;
                uVar15 = uVar15 + 1;
                uVar16 = (*(byte *)((long)pVVar2->pArray + lVar20) + uVar16) * 0x401;
                uVar16 = uVar16 >> 6 ^ uVar16;
              } while (uVar19 != uVar15);
              uVar16 = uVar16 * 9;
            }
            uVar15 = (ulong)((uVar16 >> 0xb ^ uVar16) * 0x8001) % (ulong)__ptr[1];
            if (((int)uVar15 < 0) || ((int)__ptr[1] <= (int)uVar15)) goto LAB_008af008;
            lVar20 = *(long *)(__ptr + 2);
            *(undefined4 *)(lVar25 + 4 + lVar21 * 8) = *(undefined4 *)(lVar20 + uVar15 * 4);
            *(int *)(lVar20 + uVar15 * 4) = (int)lVar21;
            lVar21 = lVar21 + 1;
          } while (lVar21 < (int)__ptr_00[1]);
        }
      }
      iVar14 = *piVar11;
      uVar8 = (int)uVar17 * iVar14;
      if (((int)uVar8 < 0) || (iVar10 = pVVar2->nSize, iVar10 <= (int)uVar8)) {
LAB_008af008:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar3 = pVVar2->pArray;
      if (iVar14 * 4 == 0) {
        uVar16 = 0;
      }
      else {
        uVar19 = 0;
        uVar16 = 0;
        do {
          lVar25 = uVar19 + (ulong)(uint)(iVar14 * (int)uVar17) * 4;
          uVar19 = uVar19 + 1;
          uVar16 = (*(byte *)((long)piVar3 + lVar25) + uVar16) * 0x401;
          uVar16 = uVar16 >> 6 ^ uVar16;
        } while ((uint)(iVar14 * 4) != uVar19);
        uVar16 = uVar16 * 9;
      }
      uVar19 = (ulong)((uVar16 >> 0xb ^ uVar16) * 0x8001) % (ulong)__ptr[1];
      iVar9 = (int)uVar19;
      if ((iVar9 < 0) || ((int)__ptr[1] <= iVar9)) goto LAB_008af008;
      puVar5 = (uint *)(uVar19 * 4 + *(long *)(__ptr + 2));
      do {
        puVar22 = puVar5;
        uVar16 = *puVar22;
        if ((ulong)uVar16 == 0xffffffff) {
          piVar23 = (int *)0x0;
        }
        else {
          if (((int)uVar16 < 0) || ((int)__ptr_00[1] <= (int)uVar16)) goto LAB_008af027;
          piVar23 = (int *)((ulong)uVar16 * 8 + *(long *)(__ptr_00 + 2));
        }
        if (piVar23 == (int *)0x0) {
          if (uVar16 != 0xffffffff) {
            __assert_fail("*pPlace == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                          ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
          }
          goto LAB_008aec0f;
        }
        uVar7 = *piVar23 * iVar14;
        if (((int)uVar7 < 0) || (iVar10 <= (int)uVar7)) goto LAB_008af008;
        iVar9 = bcmp(piVar3 + uVar8,piVar3 + uVar7,(long)iVar14 * 4);
        puVar5 = (uint *)(piVar23 + 1);
      } while (iVar9 != 0);
      if (uVar16 == 0xffffffff) {
LAB_008aec0f:
        *puVar22 = __ptr_00[1];
        uVar8 = *__ptr_00;
        if (__ptr_00[1] == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar12 = malloc(0x80);
            }
            else {
              pvVar12 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar12;
            uVar16 = 0x10;
          }
          else {
            uVar16 = uVar8 * 2;
            if ((int)uVar16 <= (int)uVar8) goto LAB_008aec9a;
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar12 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar12 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar8 << 4);
            }
            *(void **)(__ptr_00 + 2) = pvVar12;
          }
          if (pvVar12 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          *__ptr_00 = uVar16;
        }
LAB_008aec9a:
        uVar16 = __ptr_00[1];
        __ptr_00[1] = uVar16 + 1;
        *(ulong *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar16 * 8) = uVar17 | 0xffffffff00000000;
      }
      else if (((int)uVar16 < 0) || ((int)__ptr_00[1] <= (int)uVar16)) {
LAB_008af027:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      Vec_IntPush(p_00,uVar16);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar24);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  free(piVar11);
  uVar8 = p->pPars->nLutSize;
  if (-1 < (int)uVar8) {
    lVar25 = 0;
    do {
      puVar13 = (undefined8 *)malloc(0x10);
      *puVar13 = 1000;
      pvVar12 = malloc(4000);
      puVar13[1] = pvVar12;
      alStack_138[lVar25] = (long)puVar13;
      lVar25 = lVar25 + 1;
    } while ((ulong)uVar8 + 1 != lVar25);
  }
  iVar14 = p_00->nSize;
  lVar25 = (long)iVar14;
  if (0 < lVar25) {
    piVar11 = p_00->pArray;
    lVar21 = 0;
    do {
      if ((long)p->vCutData->nSize <= lVar21 + 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush((Vec_Int_t *)alStack_138[p->vCutData->pArray[lVar21 + 2]],
                  *(int *)((long)piVar11 + lVar21));
      lVar21 = lVar21 + 4;
    } while (lVar25 * 4 - lVar21 != 0);
  }
  if (-1 < p->pPars->nLutSize) {
    iVar10 = 1;
    if (1 < iVar14) {
      iVar10 = iVar14;
    }
    uVar17 = 0;
    do {
      lVar21 = alStack_138[uVar17];
      uVar8 = *(uint *)(lVar21 + 4);
      uVar19 = (ulong)uVar8;
      iVar9 = 0;
      if (uVar19 != 0) {
        iVar9 = **(int **)(lVar21 + 8);
        if (1 < (int)uVar8) {
          uVar15 = 1;
          do {
            iVar1 = (*(int **)(lVar21 + 8))[uVar15];
            if (iVar9 <= iVar1) {
              iVar9 = iVar1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar19 != uVar15);
        }
      }
      pvVar12 = calloc((long)(iVar9 + 1),1);
      if ((int)uVar8 < 1) {
        uVar24 = 0;
      }
      else {
        lVar21 = *(long *)(lVar21 + 8);
        uVar15 = 0;
        uVar24 = 0;
        do {
          lVar20 = (long)*(int *)(lVar21 + uVar15 * 4);
          if (*(char *)((long)pvVar12 + lVar20) == '\0') {
            *(undefined1 *)((long)pvVar12 + lVar20) = 1;
            uVar24 = uVar24 + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
      }
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
      }
      uVar16 = 1;
      if (1 < (int)uVar8) {
        uVar16 = uVar8;
      }
      printf("%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",
             ((double)(int)uVar8 * 100.0) / (double)iVar10,
             ((double)(int)uVar24 * 100.0) / (double)(int)uVar16,uVar17 & 0xffffffff,uVar19,
             (ulong)uVar24);
      bVar4 = (long)uVar17 < (long)p->pPars->nLutSize;
      uVar17 = uVar17 + 1;
    } while (bVar4);
  }
  if (-1 < p->pPars->nLutSize) {
    lVar21 = -1;
    do {
      pvVar12 = (void *)alStack_138[lVar21 + 1];
      if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar12 + 8));
        *(undefined8 *)((long)pvVar12 + 8) = 0;
      }
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < p->pPars->nLutSize);
  }
  uVar8 = 0;
  iVar10 = 0;
  if (iVar14 != 0) {
    iVar10 = *p_00->pArray;
    if (1 < iVar14) {
      lVar21 = 1;
      do {
        iVar9 = p_00->pArray[lVar21];
        if (iVar10 <= iVar9) {
          iVar10 = iVar9;
        }
        lVar21 = lVar21 + 1;
      } while (lVar25 != lVar21);
    }
  }
  pvVar12 = calloc((long)(iVar10 + 1),1);
  if (0 < iVar14) {
    piVar11 = p_00->pArray;
    lVar21 = 0;
    uVar8 = 0;
    do {
      if (*(char *)((long)pvVar12 + (long)piVar11[lVar21]) == '\0') {
        *(undefined1 *)((long)pvVar12 + (long)piVar11[lVar21]) = 1;
        uVar8 = uVar8 + 1;
      }
      lVar21 = lVar21 + 1;
    } while (lVar25 != lVar21);
  }
  if (pvVar12 != (void *)0x0) {
    free(pvVar12);
  }
  iVar14 = p->vCutData->nSize;
  iVar10 = iVar14 + 3;
  if (-1 < iVar14) {
    iVar10 = iVar14;
  }
  uVar16 = iVar10 >> 2;
  uVar24 = 1;
  if (1 < (int)uVar16) {
    uVar24 = uVar16;
  }
  printf("Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",0x4059000000000000,
         ((double)(int)uVar8 * 100.0) / (double)(int)uVar24,(ulong)uVar16,(ulong)uVar8);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void If_ManCacheAnalize( If_Man_t * p )
{
    Vec_Int_t * vRes, * vTest[32];
    int i, Entry, uUnique;
    vRes = Hsh_IntManHashArray( p->vCutData, 4 );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        vTest[i] = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRes, Entry, i )
        Vec_IntPush( vTest[Vec_IntEntry(p->vCutData, 4*i+2)], Entry );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
    {
        uUnique = Vec_IntCountUnique(vTest[i]);
        printf( "%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
            i, Vec_IntSize(vTest[i]), 100.0*Vec_IntSize(vTest[i])/Abc_MaxInt(1, Vec_IntSize(vRes)), 
            uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(vTest[i])) );
    }
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        Vec_IntFree( vTest[i] );
    uUnique = Vec_IntCountUnique(vRes);
    printf( "Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
        Vec_IntSize(p->vCutData)/4, 100.0, uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(p->vCutData)/4) );
    Vec_IntFree( vRes );
}